

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O1

void __thiscall proto2_unittest::DupEnum::~DupEnum(DupEnum *this)

{
  InternalMetadata *this_00;
  ulong uVar1;
  LogMessageFatal LStack_18;
  
  this_00 = &(this->super_MessageLite)._internal_metadata_;
  if (((this->super_MessageLite)._internal_metadata_.ptr_ & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DeleteOutOfLineHelper<std::__cxx11::string>
              (this_00);
  }
  uVar1 = this_00->ptr_;
  if ((uVar1 & 1) != 0) {
    uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
  }
  if (uVar1 == 0) {
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&LStack_18,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/google/protobuf/unittest_lite.pb.cc"
             ,0x3270,"this_.GetArena() == nullptr");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_18);
}

Assistant:

inline void DupEnum::SharedDtor(MessageLite& self) {
  DupEnum& this_ = static_cast<DupEnum&>(self);
  this_._internal_metadata_.Delete<std::string>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  this_._impl_.~Impl_();
}